

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# TPZElementMatrixT.cpp
# Opt level: O1

void __thiscall
TPZElementMatrixT<std::complex<double>_>::SetMatrixMinSize
          (TPZElementMatrixT<std::complex<double>_> *this,short NumBli,short NumBlj,short BlSizei,
          short BlSizej)

{
  long lVar1;
  complex<double> *pcVar2;
  undefined6 in_register_0000000a;
  ulong uVar3;
  undefined6 in_register_00000032;
  long lVar4;
  long lVar5;
  
  lVar1 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.
          super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fRow;
  lVar4 = (long)(int)CONCAT62(in_register_0000000a,BlSizei) *
          (long)(int)CONCAT62(in_register_00000032,NumBli);
  if ((lVar4 <= lVar1) &&
     ((long)BlSizej * (long)NumBlj <=
      (this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
      super_TPZBaseMatrix.fCol)) {
    return;
  }
  lVar5 = (long)BlSizej * (long)NumBlj;
  uVar3 = lVar5 * lVar4;
  if (uVar3 - lVar1 * (this->fMat).super_TPZFMatrix<std::complex<double>_>.
                      super_TPZMatrix<std::complex<double>_>.super_TPZBaseMatrix.fCol != 0) {
    pcVar2 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem;
    if ((pcVar2 != (complex<double> *)0x0) &&
       (pcVar2 != (this->fMat).super_TPZFMatrix<std::complex<double>_>.fGiven)) {
      operator_delete__(pcVar2);
    }
    pcVar2 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fGiven;
    if ((pcVar2 == (complex<double> *)0x0) ||
       (lVar1 = (this->fMat).super_TPZFMatrix<std::complex<double>_>.fSize,
       uVar3 - lVar1 != 0 && lVar1 <= (long)uVar3)) {
      if (uVar3 == 0) {
        pcVar2 = (complex<double> *)0x0;
      }
      else {
        pcVar2 = (complex<double> *)operator_new__(-(ulong)(uVar3 >> 0x3c != 0) | uVar3 * 0x10);
        memset(pcVar2,0,uVar3 * 0x10);
      }
    }
    (this->fMat).super_TPZFMatrix<std::complex<double>_>.fElem = pcVar2;
    if (pcVar2 == (complex<double> *)0x0 && uVar3 != 0) {
      TPZFMatrix<std::complex<double>_>::Error("Resize <memory allocation error>.",(char *)0x0);
    }
  }
  (this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
  super_TPZBaseMatrix.fRow = lVar4;
  (this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
  super_TPZBaseMatrix.fCol = lVar5;
  (*(this->fMat).super_TPZFMatrix<std::complex<double>_>.super_TPZMatrix<std::complex<double>_>.
    super_TPZBaseMatrix.super_TPZSavable._vptr_TPZSavable[0xf])(&this->fMat);
  return;
}

Assistant:

void TPZElementMatrixT<TVar>::SetMatrixMinSize(short NumBli, short NumBlj, 
										short BlSizei, short BlSizej) {
	
	
	if(fMat.Rows() < NumBli*BlSizei || fMat.Cols() < NumBlj*BlSizej) {
		fMat.Redim(NumBli*BlSizei,NumBlj*BlSizej);
	}
}